

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall
libtorrent::torrent_conflict_alert::~torrent_conflict_alert(torrent_conflict_alert *this)

{
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->metadata).
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->conflicting_torrent).m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  torrent_alert::~torrent_alert(&this->super_torrent_alert);
  return;
}

Assistant:

struct TORRENT_EXPORT torrent_conflict_alert final : torrent_alert
	{
		// internal
		explicit torrent_conflict_alert(aux::stack_allocator& alloc, torrent_handle h1
			, torrent_handle h2, std::shared_ptr<torrent_info> ti);
		TORRENT_DEFINE_ALERT_PRIO(torrent_conflict_alert, 99, alert_priority::high)

		static constexpr alert_category_t static_category = alert_category::error;
		std::string message() const override;

		// the handle to the torrent in conflict. The swarm associated with this
		// torrent handle did not download the metadata, but the downloaded
		// metadata collided with this swarm's info-hash.
		torrent_handle conflicting_torrent;

		// the metadata that was received by one of the torrents in conflict.
		// One way to resolve the conflict is to remove both failing torrents
		// and re-add it using this metadata
		std::shared_ptr<torrent_info> metadata;
	}